

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLSLMaterialRenderer.cpp
# Opt level: O0

bool __thiscall
irr::video::COpenGLSLMaterialRenderer::setPixelShaderConstant
          (COpenGLSLMaterialRenderer *this,s32 index,u32 *ints,int count)

{
  GLenum GVar1;
  SUniformInfo *pSVar2;
  COpenGLExtensionHandler *this_00;
  long lVar3;
  array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo> *this_01;
  int in_ESI;
  long in_RDI;
  bool status;
  undefined8 in_stack_ffffffffffffffa8;
  u32 index_00;
  array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo> *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  COpenGLExtensionHandler *in_stack_ffffffffffffffc0;
  
  if (-1 < in_ESI) {
    index_00 = (u32)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
    pSVar2 = core::array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>::operator[]
                       (in_stack_ffffffffffffffb0,index_00);
    if (-1 < pSVar2->location) {
      pSVar2 = core::array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>::operator[]
                         (in_stack_ffffffffffffffb0,index_00);
      GVar1 = pSVar2->type;
      if (GVar1 == 0x1405) {
        this_00 = (COpenGLExtensionHandler *)(*(long *)(in_RDI + 0x10) + 0x498);
        core::array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>::operator[]
                  (in_stack_ffffffffffffffb0,index_00);
        COpenGLExtensionHandler::extGlUniform1uiv
                  (this_00,(GLint)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                   (GLsizei)in_stack_ffffffffffffffb8,(GLuint *)in_stack_ffffffffffffffb0);
        return true;
      }
      if (GVar1 == 0x8dc6) {
        lVar3 = *(long *)(in_RDI + 0x10) + 0x498;
        core::array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>::operator[]
                  (in_stack_ffffffffffffffb0,index_00);
        COpenGLExtensionHandler::extGlUniform2uiv
                  (in_stack_ffffffffffffffc0,(GLint)((ulong)lVar3 >> 0x20),(GLsizei)lVar3,
                   (GLuint *)in_stack_ffffffffffffffb0);
        return true;
      }
      if (GVar1 == 0x8dc7) {
        this_01 = (array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo> *)
                  (*(long *)(in_RDI + 0x10) + 0x498);
        core::array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>::operator[]
                  (this_01,index_00);
        COpenGLExtensionHandler::extGlUniform3uiv
                  (in_stack_ffffffffffffffc0,(GLint)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                   (GLsizei)in_stack_ffffffffffffffb8,(GLuint *)this_01);
        return true;
      }
      if (GVar1 != 0x8dc8) {
        return false;
      }
      core::array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>::operator[]
                (in_stack_ffffffffffffffb0,(u32)((ulong)(*(long *)(in_RDI + 0x10) + 0x498) >> 0x20))
      ;
      COpenGLExtensionHandler::extGlUniform4uiv
                (in_stack_ffffffffffffffc0,(GLint)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                 (GLsizei)in_stack_ffffffffffffffb8,(GLuint *)in_stack_ffffffffffffffb0);
      return true;
    }
  }
  return false;
}

Assistant:

bool COpenGLSLMaterialRenderer::setPixelShaderConstant(s32 index, const u32 *ints, int count)
{
	if (index < 0 || UniformInfo[index].location < 0)
		return false;

	bool status = true;

	switch (UniformInfo[index].type) {
	case GL_UNSIGNED_INT:
		Driver->extGlUniform1uiv(UniformInfo[index].location, count, reinterpret_cast<const GLuint *>(ints));
		break;
#if defined(GL_VERSION_3_0)
	case GL_UNSIGNED_INT_VEC2:
		Driver->extGlUniform2uiv(UniformInfo[index].location, count / 2, reinterpret_cast<const GLuint *>(ints));
		break;
	case GL_UNSIGNED_INT_VEC3:
		Driver->extGlUniform3uiv(UniformInfo[index].location, count / 3, reinterpret_cast<const GLuint *>(ints));
		break;
	case GL_UNSIGNED_INT_VEC4:
		Driver->extGlUniform4uiv(UniformInfo[index].location, count / 4, reinterpret_cast<const GLuint *>(ints));
		break;
#endif
	default:
		status = false;
		break;
	}
	return status;
}